

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  int iVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  JSAMPLE *pJVar4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var5;
  long lVar6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  INT32 *Cbgtab;
  INT32 *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  byte *pbStack_78;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr01;
  JSAMPROW inptr00;
  JSAMPROW outptr1;
  JSAMPROW outptr0;
  int cr;
  int cb;
  int cblue;
  int cgreen;
  int cred;
  int y;
  my_upsample_ptr upsample;
  JSAMPARRAY output_buf_local;
  JDIMENSION in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->upsample;
  pJVar4 = cinfo->sample_range_limit;
  p_Var5 = pjVar3[1].upsample;
  lVar6 = *(long *)&pjVar3[1].need_context_rows;
  p_Var7 = pjVar3[2].start_pass;
  p_Var8 = pjVar3[2].upsample;
  inptr01 = (*input_buf)[in_row_group_ctr << 1];
  inptr1 = (*input_buf)[in_row_group_ctr * 2 + 1];
  outptr1 = *output_buf;
  inptr00 = output_buf[1];
  pbStack_78 = input_buf[2][in_row_group_ctr];
  inptr2 = input_buf[1][in_row_group_ctr];
  for (range_limit._4_4_ = cinfo->output_width >> 1; range_limit._4_4_ != 0;
      range_limit._4_4_ = range_limit._4_4_ - 1) {
    iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*pbStack_78 * 4);
    iVar9 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*inptr2 * 8) +
                         *(long *)(p_Var7 + (long)(int)(uint)*pbStack_78 * 8)) >> 0x10);
    iVar2 = *(int *)(lVar6 + (long)(int)(uint)*inptr2 * 4);
    pbVar11 = inptr01 + 1;
    uVar10 = (uint)*inptr01;
    *outptr1 = pJVar4[(int)(uVar10 + iVar1)];
    outptr1[1] = pJVar4[(int)(uVar10 + iVar9)];
    outptr1[2] = pJVar4[(int)(uVar10 + iVar2)];
    inptr01 = inptr01 + 2;
    uVar10 = (uint)*pbVar11;
    outptr1[3] = pJVar4[(int)(uVar10 + iVar1)];
    outptr1[4] = pJVar4[(int)(uVar10 + iVar9)];
    outptr1[5] = pJVar4[(int)(uVar10 + iVar2)];
    outptr1 = outptr1 + 6;
    pbVar11 = inptr1 + 1;
    uVar10 = (uint)*inptr1;
    *inptr00 = pJVar4[(int)(uVar10 + iVar1)];
    inptr00[1] = pJVar4[(int)(uVar10 + iVar9)];
    inptr00[2] = pJVar4[(int)(uVar10 + iVar2)];
    inptr1 = inptr1 + 2;
    uVar10 = (uint)*pbVar11;
    inptr00[3] = pJVar4[(int)(uVar10 + iVar1)];
    inptr00[4] = pJVar4[(int)(uVar10 + iVar9)];
    inptr00[5] = pJVar4[(int)(uVar10 + iVar2)];
    inptr00 = inptr00 + 6;
    pbStack_78 = pbStack_78 + 1;
    inptr2 = inptr2 + 1;
  }
  if ((cinfo->output_width & 1) != 0) {
    iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*pbStack_78 * 4);
    iVar9 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*inptr2 * 8) +
                         *(long *)(p_Var7 + (long)(int)(uint)*pbStack_78 * 8)) >> 0x10);
    iVar2 = *(int *)(lVar6 + (long)(int)(uint)*inptr2 * 4);
    uVar10 = (uint)*inptr01;
    *outptr1 = pJVar4[(int)(uVar10 + iVar1)];
    outptr1[1] = pJVar4[(int)(uVar10 + iVar9)];
    outptr1[2] = pJVar4[(int)(uVar10 + iVar2)];
    uVar10 = (uint)*inptr1;
    *inptr00 = pJVar4[(int)(uVar10 + iVar1)];
    inptr00[1] = pJVar4[(int)(uVar10 + iVar9)];
    inptr00[2] = pJVar4[(int)(uVar10 + iVar2)];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample (j_decompress_ptr cinfo,
		      JSAMPIMAGE input_buf, JDIMENSION in_row_group_ctr,
		      JSAMPARRAY output_buf)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  register int y, cred, cgreen, cblue;
  int cb, cr;
  register JSAMPROW outptr0, outptr1;
  JSAMPROW inptr00, inptr01, inptr1, inptr2;
  JDIMENSION col;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  int * Crrtab = upsample->Cr_r_tab;
  int * Cbbtab = upsample->Cb_b_tab;
  INT32 * Crgtab = upsample->Cr_g_tab;
  INT32 * Cbgtab = upsample->Cb_g_tab;
  SHIFT_TEMPS

  inptr00 = input_buf[0][in_row_group_ctr*2];
  inptr01 = input_buf[0][in_row_group_ctr*2 + 1];
  inptr1 = input_buf[1][in_row_group_ctr];
  inptr2 = input_buf[2][in_row_group_ctr];
  outptr0 = output_buf[0];
  outptr1 = output_buf[1];
  /* Loop for each group of output pixels */
  for (col = cinfo->output_width >> 1; col > 0; col--) {
    /* Do the chroma part of the calculation */
    cb = GETJSAMPLE(*inptr1++);
    cr = GETJSAMPLE(*inptr2++);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    /* Fetch 4 Y values and emit 4 pixels */
    y  = GETJSAMPLE(*inptr00++);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    outptr0 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr00++);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    outptr0 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr01++);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
    outptr1 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr01++);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
    outptr1 += RGB_PIXELSIZE;
  }
  /* If image width is odd, do the last output column separately */
  if (cinfo->output_width & 1) {
    cb = GETJSAMPLE(*inptr1);
    cr = GETJSAMPLE(*inptr2);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    y  = GETJSAMPLE(*inptr00);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    y  = GETJSAMPLE(*inptr01);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
  }
}